

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O2

void __thiscall draco::Mesh::DeleteAttribute(Mesh *this,int att_id)

{
  pointer pAVar1;
  
  PointCloud::DeleteAttribute(&this->super_PointCloud,att_id);
  if ((-1 < att_id) &&
     (pAVar1 = (this->attribute_data_).
               super__Vector_base<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>
               ._M_impl.super__Vector_impl_data._M_start,
     att_id < (int)((ulong)((long)(this->attribute_data_).
                                  super__Vector_base<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) >> 2)))
  {
    std::vector<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>::erase
              (&this->attribute_data_,pAVar1 + (uint)att_id);
    return;
  }
  return;
}

Assistant:

void DeleteAttribute(int att_id) override {
    PointCloud::DeleteAttribute(att_id);
    if (att_id >= 0 && att_id < static_cast<int>(attribute_data_.size())) {
      attribute_data_.erase(attribute_data_.begin() + att_id);
    }
#ifdef DRACO_TRANSCODER_SUPPORTED
    UpdateMeshFeaturesAfterDeletedAttribute(att_id);
#endif
  }